

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O2

void floor1_pack(vorbis_info_floor *i,oggpack_buffer *opb)

{
  int iVar1;
  int iVar2;
  ogg_uint32_t v;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = *(int *)((long)i + 0x348);
  oggpack_write(opb,(long)*i,5);
  iVar3 = -1;
  for (lVar5 = 0; lVar5 < *i; lVar5 = lVar5 + 1) {
    oggpack_write(opb,(long)*(int *)((long)i + lVar5 * 4 + 4),4);
    iVar1 = *(int *)((long)i + lVar5 * 4 + 4);
    if (iVar3 <= iVar1) {
      iVar3 = iVar1;
    }
  }
  lVar5 = (long)i + 0x140;
  for (lVar4 = 0; lVar4 <= iVar3; lVar4 = lVar4 + 1) {
    oggpack_write(opb,(long)*(int *)((long)i + lVar4 * 4 + 0x80) - 1,3);
    oggpack_write(opb,(long)*(int *)((long)i + lVar4 * 4 + 0xc0),2);
    if (*(int *)((long)i + lVar4 * 4 + 0xc0) != 0) {
      oggpack_write(opb,(long)*(int *)((long)i + lVar4 * 4 + 0x100),8);
    }
    for (lVar6 = 0; lVar6 < 1 << (*(byte *)((long)i + lVar4 * 4 + 0xc0) & 0x1f); lVar6 = lVar6 + 1)
    {
      oggpack_write(opb,(long)*(int *)(lVar5 + lVar6 * 4) + 1,8);
    }
    lVar5 = lVar5 + 0x20;
  }
  oggpack_write(opb,(long)*(int *)((long)i + 0x340) - 1,2);
  v = iVar2 - 1;
  iVar2 = ov_ilog(v);
  oggpack_write(opb,(long)iVar2,4);
  iVar2 = ov_ilog(v);
  lVar5 = 0;
  lVar4 = 0;
  for (lVar6 = 0; lVar6 < *i; lVar6 = lVar6 + 1) {
    lVar5 = (long)(int)lVar5 +
            (long)*(int *)((long)i + (long)*(int *)((long)i + lVar6 * 4 + 4) * 4 + 0x80);
    for (lVar4 = (long)(int)lVar4; lVar4 < lVar5; lVar4 = lVar4 + 1) {
      oggpack_write(opb,(long)*(int *)((long)i + lVar4 * 4 + 0x34c),iVar2);
    }
  }
  return;
}

Assistant:

static void floor1_pack (vorbis_info_floor *i,oggpack_buffer *opb){
  vorbis_info_floor1 *info=(vorbis_info_floor1 *)i;
  int j,k;
  int count=0;
  int rangebits;
  int maxposit=info->postlist[1];
  int maxclass=-1;

  /* save out partitions */
  oggpack_write(opb,info->partitions,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    oggpack_write(opb,info->partitionclass[j],4); /* only 0 to 15 legal */
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* save out partition classes */
  for(j=0;j<maxclass+1;j++){
    oggpack_write(opb,info->class_dim[j]-1,3); /* 1 to 8 */
    oggpack_write(opb,info->class_subs[j],2); /* 0 to 3 */
    if(info->class_subs[j])oggpack_write(opb,info->class_book[j],8);
    for(k=0;k<(1<<info->class_subs[j]);k++)
      oggpack_write(opb,info->class_subbook[j][k]+1,8);
  }

  /* save out the post list */
  oggpack_write(opb,info->mult-1,2);     /* only 1,2,3,4 legal now */
  /* maxposit cannot legally be less than 1; this is encode-side, we
     can assume our setup is OK */
  oggpack_write(opb,ov_ilog(maxposit-1),4);
  rangebits=ov_ilog(maxposit-1);

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]];
    for(;k<count;k++)
      oggpack_write(opb,info->postlist[k+2],rangebits);
  }
}